

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptLexer.cpp
# Opt level: O3

String __thiscall MiniScript::Token::ToString(Token *this)

{
  long *plVar1;
  size_t sVar2;
  StringStorage *pSVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  StringStorage *pSVar7;
  char *__s;
  undefined8 uVar8;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  undefined8 extraout_RDX_29;
  undefined8 extraout_RDX_30;
  undefined8 extraout_RDX_31;
  undefined8 extraout_RDX_32;
  undefined8 extraout_RDX_33;
  undefined8 extraout_RDX_34;
  undefined8 extraout_RDX_35;
  undefined8 extraout_RDX_36;
  undefined8 extraout_RDX_37;
  undefined8 extraout_RDX_38;
  undefined4 *in_RSI;
  size_t sVar9;
  ulong __n;
  String SVar10;
  StringStorage *local_68;
  char local_60;
  String local_58;
  String local_48;
  size_t local_38;
  
  *(undefined8 *)this = 0;
  *(undefined1 *)&(this->text).ss = 0;
  switch(*in_RSI) {
  case 0:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x6e776f6e6b6e55;
    in_RDX = extraout_RDX;
    goto LAB_00196385;
  case 1:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x64726f7779654b;
    in_RDX = extraout_RDX_16;
    goto LAB_00196385;
  case 2:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 7;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(7);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)((long)puVar5 + 3) = 0x726562;
    *puVar5 = 0x626d754e;
    in_RDX = extraout_RDX_12;
    break;
  case 3:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 7;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(7);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)((long)puVar5 + 3) = 0x676e69;
    *puVar5 = 0x69727453;
    in_RDX = extraout_RDX_14;
    break;
  case 4:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xb;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xb);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *puVar6 = 0x696669746e656449;
    *(undefined4 *)((long)puVar6 + 7) = 0x726569;
    in_RDX = extraout_RDX_07;
    break;
  case 5:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 9;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(9);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x6e6769737341704f;
    in_RDX = extraout_RDX_20;
    goto LAB_00195fdd;
  case 6:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 7;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(7);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)((long)puVar5 + 3) = 0x73756c;
    *puVar5 = 0x6c50704f;
    in_RDX = extraout_RDX_23;
    break;
  case 7:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x73756e694d704f;
    in_RDX = extraout_RDX_15;
    goto LAB_00196385;
  case 8:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x73656d6954704f;
    in_RDX = extraout_RDX_26;
    goto LAB_00196385;
  case 9:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 9;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(9);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x656469766944704f;
    in_RDX = extraout_RDX_09;
    goto LAB_00195fdd;
  case 10:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 6;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(6);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined2 *)(puVar5 + 1) = 100;
    *puVar5 = 0x6f4d704f;
    in_RDX = extraout_RDX_25;
    break;
  case 0xb:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x7265776f50704f;
    in_RDX = extraout_RDX_06;
    goto LAB_00196385;
  case 0xc:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x6c61757145704f;
    in_RDX = extraout_RDX_08;
    goto LAB_00196385;
  case 0xd:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xb;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xb);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *puVar6 = 0x757145746f4e704f;
    *(undefined4 *)((long)puVar6 + 7) = 0x6c6175;
    in_RDX = extraout_RDX_22;
    break;
  case 0xe:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 10;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(10);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *puVar6 = 0x657461657247704f;
    *(undefined2 *)(puVar6 + 1) = 0x72;
    in_RDX = extraout_RDX_04;
    break;
  case 0xf:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xd;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xd);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *(undefined8 *)((long)puVar6 + 5) = 0x6c617571457461;
    uVar8 = 0x457461657247704f;
    in_RDX = extraout_RDX_13;
    goto LAB_00196385;
  case 0x10:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 9;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(9);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x72657373654c704f;
    in_RDX = extraout_RDX_03;
LAB_00195fdd:
    *puVar6 = uVar8;
    *(undefined1 *)(puVar6 + 1) = 0;
    break;
  case 0x11:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xc;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xc);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *puVar6 = 0x71457373654c704f;
    *(undefined4 *)(puVar6 + 1) = 0x6c6175;
    in_RDX = extraout_RDX_18;
    break;
  case 0x12:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xd;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xd);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *(undefined8 *)((long)puVar6 + 5) = 0x73756c506e6769;
    in_RDX = extraout_RDX_24;
    goto LAB_0019637b;
  case 0x13:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xe;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xe);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x73756e694d6e67;
    in_RDX = extraout_RDX_30;
    goto LAB_00196377;
  case 0x14:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xe;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xe);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x73656d69546e67;
    in_RDX = extraout_RDX_19;
    goto LAB_00196377;
  case 0x15:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xf;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xf);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *(undefined8 *)((long)puVar6 + 7) = 0x6564697669446e;
    in_RDX = extraout_RDX_21;
    goto LAB_0019637b;
  case 0x16:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xc;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xc);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *puVar6 = 0x6e6769737341704f;
    *(undefined4 *)(puVar6 + 1) = 0x646f4d;
    in_RDX = extraout_RDX_29;
    break;
  case 0x17:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 0xe;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(0xe);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x7265776f506e67;
    in_RDX = extraout_RDX_31;
LAB_00196377:
    *(undefined8 *)((long)puVar6 + 6) = uVar8;
LAB_0019637b:
    uVar8 = 0x6e6769737341704f;
    goto LAB_00196385;
  case 0x18:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 7;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(7);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)((long)puVar5 + 3) = 0x6e6572;
    *puVar5 = 0x7261504c;
    in_RDX = extraout_RDX_11;
    break;
  case 0x19:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 7;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(7);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)((long)puVar5 + 3) = 0x6e6572;
    *puVar5 = 0x72615052;
    in_RDX = extraout_RDX_10;
    break;
  case 0x1a:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x6572617571534c;
    in_RDX = extraout_RDX_38;
    goto LAB_00196385;
  case 0x1b:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x65726175715352;
    in_RDX = extraout_RDX_01;
    goto LAB_00196385;
  case 0x1c:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 7;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(7);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)((long)puVar5 + 3) = 0x796c72;
    *puVar5 = 0x7275434c;
    in_RDX = extraout_RDX_36;
    break;
  case 0x1d:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 7;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(7);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined4 *)((long)puVar5 + 3) = 0x796c72;
    *puVar5 = 0x72754352;
    in_RDX = extraout_RDX_37;
    break;
  case 0x1e:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 10;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(10);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    *puVar6 = 0x4f73736572646441;
    *(undefined2 *)(puVar6 + 1) = 0x66;
    in_RDX = extraout_RDX_27;
    break;
  case 0x1f:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 6;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(6);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined2 *)(puVar5 + 1) = 0x61;
    *puVar5 = 0x6d6d6f43;
    in_RDX = extraout_RDX_17;
    break;
  case 0x20:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 4;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(4);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *puVar5 = 0x746f44;
    in_RDX = extraout_RDX_28;
    break;
  case 0x21:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 6;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(6);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *(undefined2 *)(puVar5 + 1) = 0x6e;
    *puVar5 = 0x6f6c6f43;
    in_RDX = extraout_RDX_05;
    break;
  case 0x22:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 8;
    puVar4[4] = 0xffffffffffffffff;
    puVar6 = (undefined8 *)operator_new__(8);
    puVar4[2] = puVar6;
    *(undefined8 **)this = puVar4;
    uVar8 = 0x746e656d6d6f43;
    in_RDX = extraout_RDX_02;
LAB_00196385:
    *puVar6 = uVar8;
    break;
  case 0x23:
    puVar4 = (undefined8 *)operator_new(0x30);
    puVar4[1] = 1;
    *puVar4 = &PTR__StringStorage_001bf0d8;
    puVar4[3] = 4;
    puVar4[4] = 0xffffffffffffffff;
    puVar5 = (undefined4 *)operator_new__(4);
    puVar4[2] = puVar5;
    *(undefined8 **)this = puVar4;
    *puVar5 = 0x4c4f45;
    in_RDX = extraout_RDX_00;
    break;
  default:
    goto switchD_001958c5_default;
  }
  *(undefined1 *)&(this->text).ss = 0;
switchD_001958c5_default:
  if ((*(long *)(in_RSI + 2) != 0) && (1 < *(ulong *)(*(long *)(in_RSI + 2) + 0x18))) {
    String::operator+(&local_48,(char *)this);
    pSVar3 = local_48.ss;
    local_68 = *(StringStorage **)(in_RSI + 2);
    if (local_68 == (StringStorage *)0x0) {
      local_68 = local_48.ss;
      if (local_48.ss != (StringStorage *)0x0) {
        plVar1 = &((local_48.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + 1;
      }
    }
    else if (local_48.ss == (StringStorage *)0x0) {
      plVar1 = &(local_68->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
    }
    else {
      sVar2 = (local_48.ss)->dataSize;
      sVar9 = local_68->dataSize;
      pSVar7 = (StringStorage *)operator_new(0x30);
      __n = (sVar9 + sVar2) - 1;
      (pSVar7->super_RefCountedStorage).refCount = 1;
      (pSVar7->super_RefCountedStorage)._vptr_RefCountedStorage =
           (_func_int **)&PTR__StringStorage_001bf0d8;
      pSVar7->dataSize = __n;
      pSVar7->charCount = -1;
      local_38 = sVar9;
      __s = (char *)operator_new__(__n);
      sVar9 = sVar2 - 1;
      pSVar7->data = __s;
      memset(__s,0,__n);
      memcpy(__s,pSVar3->data,sVar9);
      memcpy(__s + sVar9,local_68->data,local_38);
      local_68 = pSVar7;
    }
    local_60 = '\0';
    String::operator+(&local_58,(char *)&local_68);
    String::operator=((String *)this,&local_58);
    in_RDX = extraout_RDX_32;
    if ((local_58.ss != (StringStorage *)0x0) && (local_58.isTemp == false)) {
      plVar1 = &((local_58.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_58.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_33;
      }
      local_58.ss = (StringStorage *)0x0;
    }
    if ((local_68 != (StringStorage *)0x0) && (local_60 == '\0')) {
      plVar1 = &(local_68->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_68->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_34;
      }
      local_68 = (StringStorage *)0x0;
    }
    if ((local_48.ss != (StringStorage *)0x0) && (local_48.isTemp == false)) {
      plVar1 = &((local_48.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_48.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_35;
      }
    }
  }
  SVar10._8_8_ = in_RDX;
  SVar10.ss = (StringStorage *)this;
  return SVar10;
}

Assistant:

String Token::ToString() {
		String result;
		switch (type) {
			case Token::Type::Unknown: 			result = "Unknown"; 		break;
			case Token::Type::Keyword: 			result = "Keyword"; 		break;
			case Token::Type::Number: 			result = "Number"; 			break;
			case Token::Type::String: 			result = "String"; 			break;
			case Token::Type::Identifier: 		result = "Identifier"; 		break;
			case Token::Type::OpAssign: 		result = "OpAssign"; 		break;
			case Token::Type::OpPlus: 			result = "OpPlus"; 			break;
			case Token::Type::OpMinus: 			result = "OpMinus"; 		break;
			case Token::Type::OpTimes: 			result = "OpTimes"; 		break;
			case Token::Type::OpDivide: 		result = "OpDivide"; 		break;
			case Token::Type::OpMod: 			result = "OpMod"; 			break;
			case Token::Type::OpPower: 			result = "OpPower"; 		break;
			case Token::Type::OpEqual: 			result = "OpEqual"; 		break;
			case Token::Type::OpNotEqual: 		result = "OpNotEqual"; 		break;
			case Token::Type::OpGreater: 		result = "OpGreater"; 		break;
			case Token::Type::OpGreatEqual: 	result = "OpGreatEqual";	break;
			case Token::Type::OpLesser: 		result = "OpLesser"; 		break;
			case Token::Type::OpLessEqual: 		result = "OpLessEqual"; 	break;
			case Token::Type::OpAssignPlus:		result = "OpAssignPlus";	break;
			case Token::Type::OpAssignMinus:	result = "OpAssignMinus";	break;
			case Token::Type::OpAssignTimes:	result = "OpAssignTimes";	break;
			case Token::Type::OpAssignDivide:	result = "OpAssignDivide";	break;
			case Token::Type::OpAssignMod:		result = "OpAssignMod";		break;
			case Token::Type::OpAssignPower:	result = "OpAssignPower";	break;
			case Token::Type::LParen: 			result = "LParen"; 			break;
			case Token::Type::RParen: 			result = "RParen"; 			break;
			case Token::Type::LSquare:			result = "LSquare"; 		break;
			case Token::Type::RSquare: 			result = "RSquare"; 		break;
			case Token::Type::LCurly: 			result = "LCurly"; 			break;
			case Token::Type::RCurly: 			result = "RCurly"; 			break;
			case Token::Type::AddressOf: 		result = "AddressOf"; 		break;
			case Token::Type::Comma: 			result = "Comma"; 			break;
			case Token::Type::Dot: 				result = "Dot"; 			break;
			case Token::Type::Colon: 			result = "Colon"; 			break;
			case Token::Type::Comment: 			result = "Comment"; 		break;
			case Token::Type::EOL: 				result = "EOL"; 			break;
		}
		if (!text.empty()) result = result + "(" + text + ")";
		return result;
	}